

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS
ref_iso_cast(REF_GRID_conflict *iso_grid_ptr,REF_DBL **iso_field_ptr,REF_GRID_conflict ref_grid,
            REF_DBL *field,REF_INT ldim,REF_DBL *segment0,REF_DBL *segment1)

{
  double *pdVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_DBL *pRVar3;
  REF_CELL pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  double dVar7;
  REF_INT RVar8;
  REF_GRID ref_grid_00;
  REF_FACE pRVar9;
  REF_EDGE pRVar10;
  uint uVar11;
  REF_STATUS RVar12;
  void *pvVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  REF_DBL **ppRVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  int iVar21;
  int iVar22;
  REF_GRID_conflict pRVar23;
  bool bVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  double dVar28;
  REF_FACE ref_face;
  REF_EDGE ref_edge;
  REF_INT part;
  REF_GLOB global;
  REF_INT new_cell;
  REF_INT edge_nodes [2];
  REF_DBL tt [2];
  REF_INT edges [3];
  REF_DBL candidate1 [3];
  REF_DBL candidate0 [3];
  REF_DBL tuvw [4];
  REF_DBL triangle2 [3];
  REF_DBL triangle1 [3];
  REF_DBL triangle0 [3];
  REF_INT new_nodes [27];
  uint local_204;
  REF_INT local_200;
  REF_INT local_1fc;
  REF_GRID_conflict local_1f8;
  REF_GRID local_1f0;
  REF_DBL *local_1e8;
  REF_DBL **local_1e0;
  REF_FACE local_1d8;
  REF_EDGE local_1d0;
  void *local_1c8;
  uint local_1c0;
  int local_1bc;
  REF_GLOB local_1b8;
  REF_INT local_1ac;
  REF_INT local_1a8 [4];
  double local_198;
  double local_190;
  REF_MPI local_180;
  int local_178 [4];
  REF_DBL local_168 [4];
  REF_DBL local_148 [4];
  double local_128;
  double local_120 [3];
  REF_DBL local_108;
  REF_DBL RStack_100;
  REF_DBL local_f8;
  REF_DBL local_e8;
  REF_DBL RStack_e0;
  REF_DBL local_d8;
  REF_DBL local_c8;
  REF_DBL RStack_c0;
  REF_DBL local_b8;
  double local_b0;
  REF_INT local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_1d0 = (REF_EDGE)0x0;
  local_1d8 = (REF_FACE)0x0;
  local_1e8 = segment0;
  local_1c0 = ldim;
  uVar11 = ref_node_synchronize_globals(ref_node);
  if (uVar11 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x213,
           "ref_iso_cast",(ulong)uVar11,"sync glob");
    return uVar11;
  }
  local_1f0 = ref_grid;
  local_1e0 = iso_field_ptr;
  uVar11 = ref_grid_create(iso_grid_ptr,ref_mpi);
  ref_grid_00 = local_1f0;
  if (uVar11 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x215,
           "ref_iso_cast",(ulong)uVar11,"create");
    return uVar11;
  }
  pRVar23 = *iso_grid_ptr;
  pRVar23->twod = local_1f0->twod;
  local_180 = ref_mpi;
  uVar11 = ref_node_initialize_n_global(pRVar23->node,0);
  if (uVar11 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x218,
           "ref_iso_cast",(ulong)uVar11,"zero glob");
    return uVar11;
  }
  local_204 = 0;
  local_1f8 = pRVar23;
  if (ref_grid_00->twod == 0) {
    uVar11 = ref_face_create(&local_1d8,ref_grid_00);
    pRVar9 = local_1d8;
    if (uVar11 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x239,
             "ref_iso_cast",(ulong)uVar11,"create face");
      return uVar11;
    }
    if ((long)local_1d8->n < 0) {
      local_204 = 1;
      pcVar20 = "malloc new_node of REF_INT negative";
LAB_001759ae:
      ppRVar17 = local_1e0;
      bVar24 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x23a,
             "ref_iso_cast",pcVar20);
      pvVar13 = (void *)0x0;
    }
    else {
      pvVar13 = malloc((long)local_1d8->n << 2);
      if (pvVar13 == (void *)0x0) {
        local_204 = 2;
        pcVar20 = "malloc new_node of REF_INT NULL";
        goto LAB_001759ae;
      }
      bVar24 = true;
      ppRVar17 = local_1e0;
      if (0 < pRVar9->n) {
        lVar15 = 0;
        do {
          *(undefined4 *)((long)pvVar13 + lVar15 * 4) = 0xffffffff;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pRVar9->n);
      }
    }
    pRVar23 = local_1f8;
    if (!bVar24) {
      return local_204;
    }
    local_200 = 0;
    local_1c8 = pvVar13;
    if (0 < local_1d8->n) {
      do {
        pRVar9 = local_1d8;
        RVar8 = local_200;
        pRVar3 = ref_node->real;
        pRVar5 = local_1d8->f2n;
        local_b8 = pRVar3[(long)pRVar5[local_200 * 4] * 0xf + 2];
        local_c8 = pRVar3[(long)pRVar5[local_200 * 4] * 0xf];
        RStack_c0 = (pRVar3 + (long)pRVar5[local_200 * 4] * 0xf)[1];
        local_d8 = pRVar3[(long)pRVar5[local_200 * 4 + 1] * 0xf + 2];
        local_e8 = pRVar3[(long)pRVar5[local_200 * 4 + 1] * 0xf];
        RStack_e0 = (pRVar3 + (long)pRVar5[local_200 * 4 + 1] * 0xf)[1];
        local_108 = pRVar3[(long)pRVar5[local_200 * 4 + 2] * 0xf];
        RStack_100 = (pRVar3 + (long)pRVar5[local_200 * 4 + 2] * 0xf)[1];
        local_f8 = pRVar3[(long)pRVar5[local_200 * 4 + 2] * 0xf + 2];
        RVar12 = ref_iso_triangle_segment
                           (&local_c8,&local_e8,&local_108,local_1e8,segment1,&local_128);
        if (RVar12 == 0) {
          uVar26 = SUB84(local_120[0],0);
          uVar27 = (undefined4)((ulong)local_120[0] >> 0x20);
          if (local_120[1] <= local_120[0]) {
            uVar26 = SUB84(local_120[1],0);
            uVar27 = (undefined4)((ulong)local_120[1] >> 0x20);
          }
          if (local_120[2] <= (double)CONCAT44(uVar27,uVar26)) {
            uVar26 = SUB84(local_120[2],0);
            uVar27 = (undefined4)((ulong)local_120[2] >> 0x20);
          }
          if (0.0 < (double)CONCAT44(uVar27,uVar26) || (double)CONCAT44(uVar27,uVar26) == 0.0) {
            dVar7 = local_128;
            if (1.0 - local_128 <= local_128) {
              dVar7 = 1.0 - local_128;
            }
            if (0.0 <= dVar7) {
              uVar11 = ref_face_part(pRVar9,ref_node,RVar8,&local_1bc);
              if (uVar11 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x24d,"ref_iso_cast",(ulong)uVar11,"face part");
                return uVar11;
              }
              if (local_180->id == local_1bc) {
                uVar11 = ref_node_next_global(pRVar23->node,&local_1b8);
                if (uVar11 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x250,"ref_iso_cast",(ulong)uVar11,"next global");
                  return uVar11;
                }
                uVar11 = ref_node_add(pRVar23->node,local_1b8,
                                      (REF_INT *)((long)pvVar13 + (long)local_200 * 4));
                if (uVar11 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x252,"ref_iso_cast",(ulong)uVar11,"add node");
                  return uVar11;
                }
                iVar21 = *(int *)((long)pvVar13 + (long)local_200 * 4);
                pRVar3 = pRVar23->node->real;
                lVar15 = 0;
                do {
                  pRVar3[(long)iVar21 * 0xf + lVar15] =
                       segment1[lVar15] * local_128 + local_1e8[lVar15] * (1.0 - local_128);
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
              }
            }
          }
        }
        local_200 = local_200 + 1;
        ppRVar17 = local_1e0;
      } while (local_200 < local_1d8->n);
    }
  }
  else {
    uVar11 = ref_edge_create(&local_1d0,ref_grid_00);
    pRVar10 = local_1d0;
    if (uVar11 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x21b,
             "ref_iso_cast",(ulong)uVar11,"create edge");
      return uVar11;
    }
    if ((long)local_1d0->n < 0) {
      local_204 = 1;
      pcVar20 = "malloc new_node of REF_INT negative";
LAB_001756dd:
      ppRVar17 = local_1e0;
      bVar24 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x21c,
             "ref_iso_cast",pcVar20);
      pvVar13 = (void *)0x0;
    }
    else {
      pvVar13 = malloc((long)local_1d0->n << 2);
      if (pvVar13 == (void *)0x0) {
        local_204 = 2;
        pcVar20 = "malloc new_node of REF_INT NULL";
        goto LAB_001756dd;
      }
      bVar24 = true;
      ppRVar17 = local_1e0;
      if (0 < pRVar10->n) {
        lVar15 = 0;
        do {
          *(undefined4 *)((long)pvVar13 + lVar15 * 4) = 0xffffffff;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pRVar10->n);
      }
    }
    pRVar23 = local_1f8;
    if (!bVar24) {
      return local_204;
    }
    local_1fc = 0;
    local_1c8 = pvVar13;
    if (0 < local_1d0->n) {
      do {
        pRVar10 = local_1d0;
        RVar8 = local_1fc;
        pRVar3 = ref_node->real;
        lVar16 = (long)local_1d0->e2n[local_1fc * 2];
        lVar15 = (long)local_1d0->e2n[local_1fc * 2 + 1];
        local_148[2] = pRVar3[lVar16 * 0xf + 2];
        local_148[0] = pRVar3[lVar16 * 0xf];
        local_148[1] = (pRVar3 + lVar16 * 0xf)[1];
        local_168[0] = pRVar3[lVar15 * 0xf];
        local_168[1] = (pRVar3 + lVar15 * 0xf)[1];
        local_168[2] = pRVar3[lVar15 * 0xf + 2];
        RVar12 = ref_iso_segment_segment(local_148,local_168,local_1e8,segment1,&local_198);
        if (RVar12 == 0) {
          dVar7 = local_198;
          if (1.0 - local_198 <= local_198) {
            dVar7 = 1.0 - local_198;
          }
          if (0.0 <= dVar7) {
            dVar28 = 1.0 - local_190;
            dVar7 = local_190;
            if (dVar28 <= local_190) {
              dVar7 = dVar28;
            }
            if (0.0 <= dVar7) {
              local_b0 = dVar28;
              uVar11 = ref_edge_part(pRVar10,RVar8,&local_1bc);
              if (uVar11 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x22c,"ref_iso_cast",(ulong)uVar11,"edge part");
                return uVar11;
              }
              if (local_180->id == local_1bc) {
                uVar11 = ref_node_next_global(pRVar23->node,&local_1b8);
                if (uVar11 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x22f,"ref_iso_cast",(ulong)uVar11,"next global");
                  return uVar11;
                }
                uVar11 = ref_node_add(pRVar23->node,local_1b8,
                                      (REF_INT *)((long)pvVar13 + (long)local_1fc * 4));
                if (uVar11 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x231,"ref_iso_cast",(ulong)uVar11,"add node");
                  return uVar11;
                }
                iVar21 = *(int *)((long)pvVar13 + (long)local_1fc * 4);
                pRVar3 = pRVar23->node->real;
                lVar15 = 0;
                do {
                  pRVar3[(long)iVar21 * 0xf + lVar15] =
                       local_168[lVar15] * local_b0 + local_148[lVar15] * local_190;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
              }
            }
          }
        }
        local_1fc = local_1fc + 1;
        ppRVar17 = local_1e0;
      } while (local_1fc < local_1d0->n);
    }
  }
  uVar11 = local_1c0;
  if (field == (REF_DBL *)0x0) {
    *ppRVar17 = (REF_DBL *)0x0;
    goto LAB_0017611d;
  }
  uVar14 = pRVar23->node->max * local_1c0;
  if ((int)uVar14 < 0) {
    local_204 = 1;
    pcVar20 = "malloc *iso_field_ptr of REF_DBL negative";
LAB_00175ee8:
    bVar24 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x261,
           "ref_iso_cast",pcVar20);
  }
  else {
    local_1e0 = (REF_DBL **)malloc((ulong)uVar14 << 3);
    *ppRVar17 = (REF_DBL *)local_1e0;
    if (local_1e0 == (REF_DBL **)0x0) {
      local_204 = 2;
      pcVar20 = "malloc *iso_field_ptr of REF_DBL NULL";
      goto LAB_00175ee8;
    }
    if (local_1f0->twod == 0) {
      local_200 = 0;
      bVar24 = true;
      if (0 < local_1d8->n) {
        do {
          iVar21 = *(int *)((long)local_1c8 + (long)local_200 * 4);
          if (iVar21 != -1) {
            pRVar3 = ref_node->real;
            pRVar5 = local_1d8->f2n;
            local_b8 = pRVar3[(long)pRVar5[local_200 * 4] * 0xf + 2];
            local_c8 = pRVar3[(long)pRVar5[local_200 * 4] * 0xf];
            RStack_c0 = (pRVar3 + (long)pRVar5[local_200 * 4] * 0xf)[1];
            local_d8 = pRVar3[(long)pRVar5[local_200 * 4 + 1] * 0xf + 2];
            local_e8 = pRVar3[(long)pRVar5[local_200 * 4 + 1] * 0xf];
            RStack_e0 = (pRVar3 + (long)pRVar5[local_200 * 4 + 1] * 0xf)[1];
            local_108 = pRVar3[(long)pRVar5[local_200 * 4 + 2] * 0xf];
            RStack_100 = (pRVar3 + (long)pRVar5[local_200 * 4 + 2] * 0xf)[1];
            local_f8 = pRVar3[(long)pRVar5[local_200 * 4 + 2] * 0xf + 2];
            uVar14 = ref_iso_triangle_segment
                               (&local_c8,&local_e8,&local_108,local_1e8,segment1,&local_128);
            if (uVar14 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x287,"ref_iso_cast",(ulong)uVar14,"tuvw");
              local_204 = uVar14;
              goto LAB_00176104;
            }
            if (0 < (int)local_1c0) {
              pRVar5 = local_1d8->f2n;
              uVar18 = 0;
              do {
                pRVar3 = (REF_DBL *)0x0;
                lVar15 = 0;
                do {
                  pdVar1 = local_120 + lVar15;
                  lVar16 = (long)local_200 * 4 + lVar15;
                  lVar15 = lVar15 + 1;
                  pRVar3 = (REF_DBL *)
                           ((double)pRVar3 +
                           *pdVar1 * field[uVar18 + (long)pRVar5[lVar16] * (long)(int)uVar11]);
                } while (lVar15 != 3);
                local_1e0[(long)(int)(iVar21 * local_1c0) + uVar18] = pRVar3;
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar11);
            }
          }
          local_200 = local_200 + 1;
        } while (local_200 < local_1d8->n);
LAB_001760f6:
        bVar24 = true;
        pRVar23 = local_1f8;
      }
    }
    else {
      local_1fc = 0;
      bVar24 = true;
      if (0 < local_1d0->n) {
LAB_00175d25:
        iVar21 = *(int *)((long)local_1c8 + (long)local_1fc * 4);
        if (iVar21 == -1) goto LAB_00175ea0;
        pRVar3 = ref_node->real;
        lVar16 = (long)local_1d0->e2n[local_1fc * 2];
        lVar15 = (long)local_1d0->e2n[local_1fc * 2 + 1];
        local_148[2] = pRVar3[lVar16 * 0xf + 2];
        local_148[0] = pRVar3[lVar16 * 0xf];
        local_148[1] = (pRVar3 + lVar16 * 0xf)[1];
        local_168[0] = pRVar3[lVar15 * 0xf];
        local_168[1] = (pRVar3 + lVar15 * 0xf)[1];
        local_168[2] = pRVar3[lVar15 * 0xf + 2];
        uVar14 = ref_iso_segment_segment(local_148,local_168,local_1e8,segment1,&local_198);
        if (uVar14 == 0) {
          if (0 < (int)local_1c0) {
            iVar22 = local_1d0->e2n[(long)local_1fc * 2];
            iVar2 = local_1d0->e2n[local_1fc * 2 + 1];
            uVar18 = 0;
            do {
              local_1e0[(long)(int)(iVar21 * local_1c0) + uVar18] =
                   (REF_DBL *)
                   (field[(long)iVar22 * (long)(int)uVar11 + uVar18] * (1.0 - local_190) +
                   field[(long)iVar2 * (long)(int)uVar11 + uVar18] * local_190);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          goto LAB_00175ea0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x26f
               ,"ref_iso_cast",(ulong)uVar14,"seg-seg");
        local_204 = uVar14;
LAB_00176104:
        bVar24 = false;
        pRVar23 = local_1f8;
      }
    }
  }
  if (!bVar24) {
    return local_204;
  }
LAB_0017611d:
  if (local_1f0->twod == 0) {
    pRVar4 = local_1f0->cell[8];
    if (0 < pRVar4->max) {
      iVar21 = 0;
      do {
        if (pRVar4->c2n[(long)pRVar4->size_per * (long)iVar21] != -1) {
          local_1e8 = (REF_DBL *)CONCAT44(local_1e8._4_4_,iVar21);
          uVar11 = 0;
          if (0 < pRVar4->face_per) {
            lVar16 = 0;
            lVar15 = 0;
            do {
              pRVar5 = pRVar4->c2n;
              pRVar6 = pRVar4->f2n;
              lVar19 = 0;
              do {
                local_178[lVar19] =
                     pRVar5[(long)pRVar4->size_per * (long)iVar21 +
                            (long)*(int *)((long)pRVar6 + lVar19 * 4 + lVar16)];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar14 = ref_face_with(local_1d8,local_178,&local_200);
              if (uVar14 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x2b9,"ref_iso_cast",(ulong)uVar14,"get face");
                bVar24 = false;
                pRVar23 = local_1f8;
                local_204 = uVar14;
                goto LAB_00176496;
              }
              if (*(int *)((long)local_1c8 + (long)local_200 * 4) != -1) {
                local_1a8[(int)uVar11] = local_200;
                uVar11 = uVar11 + 1;
              }
              lVar15 = lVar15 + 1;
              lVar16 = lVar16 + 0x10;
            } while (lVar15 < pRVar4->face_per);
            uVar11 = (uint)(uVar11 == 2);
            pRVar23 = local_1f8;
          }
          bVar24 = true;
          if ((char)uVar11 != '\0') {
            local_a8 = *(REF_INT *)((long)local_1c8 + (long)local_1a8[0] * 4);
            local_a4 = *(undefined4 *)((long)local_1c8 + (long)local_1a8[1] * 4);
            local_a0 = 1;
            uVar11 = ref_cell_add(pRVar23->cell[0],&local_a8,&local_1ac);
            bVar24 = uVar11 == 0;
            if (!bVar24) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x2c3,"ref_iso_cast",(ulong)uVar11,"add");
              local_204 = uVar11;
            }
          }
LAB_00176496:
          iVar21 = (int)local_1e8;
          if (!bVar24) {
            return local_204;
          }
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 < pRVar4->max);
    }
  }
  else {
    pRVar4 = local_1f0->cell[3];
    if (0 < pRVar4->max) {
      iVar21 = 0;
      do {
        if (pRVar4->c2n[(long)pRVar4->size_per * (long)iVar21] != -1) {
          bVar24 = false;
          if (0 < pRVar4->edge_per) {
            local_1e8 = (REF_DBL *)CONCAT44(local_1e8._4_4_,iVar21);
            lVar16 = 0;
            lVar15 = 0;
            iVar22 = 0;
            do {
              pRVar5 = pRVar4->c2n;
              iVar2 = pRVar4->size_per;
              pRVar6 = pRVar4->e2n;
              lVar19 = 0;
              do {
                local_1a8[lVar19] =
                     pRVar5[(long)*(int *)((long)pRVar6 + lVar19 * 4 + lVar16) +
                            (long)iVar2 * (long)iVar21];
                lVar19 = lVar19 + 1;
              } while (lVar19 == 1);
              uVar11 = ref_edge_with(local_1d0,local_1a8[0],local_1a8[1],&local_1fc);
              if (uVar11 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x2a1,"ref_iso_cast",(ulong)uVar11,"get edge");
                bVar25 = false;
                pRVar23 = local_1f8;
                iVar21 = (int)local_1e8;
                local_204 = uVar11;
                goto LAB_001762de;
              }
              if (*(int *)((long)local_1c8 + (long)local_1fc * 4) != -1) {
                local_178[iVar22] = local_1fc;
                iVar22 = iVar22 + 1;
              }
              lVar15 = lVar15 + 1;
              lVar16 = lVar16 + 8;
            } while (lVar15 < pRVar4->edge_per);
            bVar24 = iVar22 == 2;
            pRVar23 = local_1f8;
            iVar21 = (int)local_1e8;
          }
          bVar25 = true;
          if (bVar24) {
            local_a8 = *(REF_INT *)((long)local_1c8 + (long)local_178[0] * 4);
            local_a4 = *(undefined4 *)((long)local_1c8 + (long)local_178[1] * 4);
            local_a0 = 1;
            uVar11 = ref_cell_add(pRVar23->cell[0],&local_a8,&local_1ac);
            bVar25 = uVar11 == 0;
            if (!bVar25) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x2ab,"ref_iso_cast",(ulong)uVar11,"add");
              local_204 = uVar11;
            }
          }
LAB_001762de:
          if (!bVar25) {
            return local_204;
          }
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 < pRVar4->max);
    }
  }
  if ((local_1d8 == (REF_FACE)0x0) || (uVar11 = ref_face_free(local_1d8), uVar11 == 0)) {
    if ((local_1d0 == (REF_EDGE)0x0) || (uVar11 = ref_edge_free(local_1d0), uVar11 == 0)) {
      uVar11 = 0;
      if (local_1c8 != (void *)0x0) {
        free(local_1c8);
        uVar11 = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2cc,
             "ref_iso_cast",(ulong)uVar11,"free");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2c9,
           "ref_iso_cast",(ulong)uVar11,"free");
  }
  return uVar11;
LAB_00175ea0:
  local_1fc = local_1fc + 1;
  if (local_1d0->n <= local_1fc) goto LAB_001760f6;
  goto LAB_00175d25;
}

Assistant:

REF_FCN REF_STATUS ref_iso_cast(REF_GRID *iso_grid_ptr, REF_DBL **iso_field_ptr,
                                REF_GRID ref_grid, REF_DBL *field, REF_INT ldim,
                                REF_DBL *segment0, REF_DBL *segment1) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_GRID iso_grid;
  REF_EDGE ref_edge = NULL;
  REF_FACE ref_face = NULL;
  REF_INT edge, face, i, j, part, cell;
  REF_GLOB global;
  REF_INT *new_node = NULL;
  REF_DBL candidate0[3], candidate1[3];
  REF_DBL triangle0[3], triangle1[3], triangle2[3];
  REF_DBL tt[2], ss[2], tuvw[4];
  REF_DBL inside = 0.0;
  REF_DBL t0, t1;
  REF_INT id = 1;
  REF_DBL *iso_field;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  ref_grid_twod(iso_grid) = ref_grid_twod(ref_grid);
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
    ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
    each_ref_edge(ref_edge, edge) {
      for (i = 0; i < 3; i++) {
        candidate0[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
        candidate1[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
      }
      if (REF_SUCCESS != ref_iso_segment_segment(candidate0, candidate1,
                                                 segment0, segment1, tt))
        continue;
      ss[0] = 1.0 - tt[0];
      ss[1] = 1.0 - tt[1];
      if (MIN(tt[0], ss[0]) < inside) continue;
      if (MIN(tt[1], ss[1]) < inside) continue;

      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[edge]) =
              ss[1] * candidate1[i] + tt[1] * candidate0[i];
        }
      }
    }
  } else {
    RSS(ref_face_create(&ref_face, ref_grid), "create face");
    ref_malloc_init(new_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

    each_ref_face(ref_face, face) {
      for (i = 0; i < 3; i++) {
        triangle0[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
        triangle1[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
        triangle2[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
      }
      if (REF_SUCCESS != ref_iso_triangle_segment(triangle0, triangle1,
                                                  triangle2, segment0, segment1,
                                                  tuvw))
        continue;
      if (MIN(MIN(tuvw[1], tuvw[2]), tuvw[3]) < inside) continue;
      /* exclude intersections outside of segment */
      if (MIN(tuvw[0], 1.0 - tuvw[0]) < inside) continue;

      RSS(ref_face_part(ref_face, ref_node, face, &part), "face part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[face])),
            "add node");
        t1 = tuvw[0];
        t0 = 1.0 - t1;
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[face]) =
              t1 * segment1[i] + t0 * segment0[i];
        }
      }
    }
  }
  if (NULL == field) {
    *iso_field_ptr = NULL;
  } else {
    REF_INT node;
    ref_malloc(*iso_field_ptr, ldim * ref_node_max(ref_grid_node(iso_grid)),
               REF_DBL);
    iso_field = *iso_field_ptr;
    if (ref_grid_twod(ref_grid)) {
      each_ref_edge(ref_edge, edge) {
        node = new_node[edge];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            candidate0[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
            candidate1[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
          }
          RSS(ref_iso_segment_segment(candidate0, candidate1, segment0,
                                      segment1, tt),
              "seg-seg");
          ss[0] = 1.0 - tt[0];
          ss[1] = 1.0 - tt[1];
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] =
                ss[1] * field[j + ldim * ref_edge_e2n(ref_edge, 0, edge)] +
                tt[1] * field[j + ldim * ref_edge_e2n(ref_edge, 1, edge)];
          }
        }
      }
    } else {
      each_ref_face(ref_face, face) {
        node = new_node[face];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            triangle0[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
            triangle1[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
            triangle2[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
          }
          RSS(ref_iso_triangle_segment(triangle0, triangle1, triangle2,
                                       segment0, segment1, tuvw),
              "tuvw");
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] = 0.0;
            for (i = 0; i < 3; i++) {
              iso_field[j + ldim * node] +=
                  tuvw[i + 1] *
                  field[j + ldim * ref_face_f2n(ref_face, i, face)];
            }
          }
        }
      }
    }
  }

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_edge, node, edge_nodes[2];
      REF_INT nedge, edges[3];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        for (node = 0; node < 2; node++) {
          edge_nodes[node] = ref_cell_e2n(ref_cell, node, cell_edge, cell);
        }
        RSS(ref_edge_with(ref_edge, edge_nodes[0], edge_nodes[1], &edge),
            "get edge");
        if (REF_EMPTY != new_node[edge]) {
          edges[nedge] = edge;
          nedge++;
        }
      }
      if (2 == nedge) {
        new_nodes[0] = new_node[edges[0]];
        new_nodes[1] = new_node[edges[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_face, node, face_nodes[4];
      REF_INT nface, faces[4];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nface = 0;
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, face_nodes, &face), "get face");
        if (REF_EMPTY != new_node[face]) {
          faces[nface] = face;
          nface++;
        }
      }
      if (2 == nface) {
        new_nodes[0] = new_node[faces[0]];
        new_nodes[1] = new_node[faces[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  }

  if (NULL != ref_face) {
    RSS(ref_face_free(ref_face), "free");
  }
  if (NULL != ref_edge) {
    RSS(ref_edge_free(ref_edge), "free");
  }
  ref_free(new_node);
  return REF_SUCCESS;
}